

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_unpack(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  int iVar3;
  lua_Integer lVar4;
  size_t sVar6;
  int size;
  int n;
  lua_Integer lVar5;
  
  luaL_checktype(L,1,5);
  lVar4 = luaL_optinteger(L,2,1);
  pTVar1 = L->base + 2;
  if ((pTVar1 == &luaO_nilobject_ || L->top <= pTVar1) || (L->base[2].tt < 1)) {
    sVar6 = lua_objlen(L,1);
    iVar2 = (int)sVar6;
  }
  else {
    lVar5 = luaL_checkinteger(L,3);
    iVar2 = (int)lVar5;
  }
  n = (int)lVar4;
  if (n <= iVar2) {
    if (-1 < iVar2 - n) {
      size = (iVar2 - n) + 1;
      iVar3 = lua_checkstack(L,size);
      if (iVar3 != 0) {
        lua_rawgeti(L,1,n);
        if (iVar2 <= n) {
          return size;
        }
        do {
          n = n + 1;
          lua_rawgeti(L,1,n);
        } while (n != iVar2);
        return size;
      }
    }
    luaL_error(L,"too many results to unpack");
  }
  return 0;
}

Assistant:

static int luaB_unpack(lua_State*L){
int i,e,n;
luaL_checktype(L,1,5);
i=luaL_optint(L,2,1);
e=luaL_opt(L,luaL_checkint,3,luaL_getn(L,1));
if(i>e)return 0;
n=e-i+1;
if(n<=0||!lua_checkstack(L,n))
return luaL_error(L,"too many results to unpack");
lua_rawgeti(L,1,i);
while(i++<e)
lua_rawgeti(L,1,i);
return n;
}